

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  anon_struct_8_0_00000001_for___align aVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type *psVar3;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar4;
  char *pcVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 uVar8;
  int iVar9;
  ostream *poVar10;
  anon_struct_8_0_00000001_for___align *paVar11;
  long *plVar12;
  const_iterator cVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  Property *args;
  size_t __n;
  storage_t<double> __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  pointer pcVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  bool bVar19;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  optional<tinyusdz::Animatable<float>_> av;
  _Alloc_hider in_stack_fffffffffffff9f8;
  _Alloc_hider local_600;
  undefined1 local_5f8 [8];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [8];
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [72];
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_570;
  storage_t<double> local_568;
  undefined8 *local_560 [2];
  undefined8 local_550 [2];
  undefined1 local_540 [48];
  undefined1 local_510 [16];
  undefined1 local_500 [80];
  _Base_ptr local_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_498 [24];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480 [2];
  ios_base local_438 [264];
  string local_330;
  string local_310 [16];
  undefined8 local_300 [2];
  undefined1 local_2f0 [32];
  key_type local_2d0;
  undefined1 local_2b0 [12];
  undefined4 uStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  undefined1 auStack_290 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  undefined1 auStack_268 [40];
  ios_base aiStack_240 [16];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  bool local_218;
  storage_t<tinyusdz::Token> local_210;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_1e0 [2];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined4 local_e8 [2];
  undefined1 local_e0 [56];
  undefined1 local_a8 [16];
  undefined1 auStack_98 [24];
  undefined1 local_80 [32];
  storage_t<tinyusdz::Token> local_60;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  
  local_500._24_8_ = (long)local_500 + 8;
  local_500._8_4_ = _S_red;
  local_500._16_8_ = (_Link_type)0x0;
  local_500._40_8_ = 0;
  local_5b8._32_8_ = err;
  local_5b8._56_8_ = preader;
  local_5b8._64_8_ = warn;
  local_500._32_8_ = local_500._24_8_;
  local_2b0._0_8_ = &local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_500,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._0_8_ != &local_2a0) {
    operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
  }
  p_Var15 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4b0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var15 != local_4b0) {
    local_5b8._48_8_ = local_5b8._56_8_ + 0x730;
    local_500._64_8_ = local_5b8._56_8_ + 0x940;
    local_500._48_8_ = local_5b8._56_8_ + 0x958;
    local_570 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_5b8._56_8_ + 0x990);
    local_500._72_8_ = local_5b8._56_8_ + 0xc10;
    local_500._56_8_ = local_5b8._56_8_ + 0x6d0;
    do {
      local_540._0_8_ = local_540 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_540,*(long *)(p_Var15 + 1),
                 (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
      local_5b8._0_8_ = local_5b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"inputs:fallback","");
      uVar7 = local_540._8_8_;
      uVar6 = local_5b8._8_8_;
      local_600._M_p = auStack_5f0;
      local_5f8[0] = false;
      local_5f8._1_3_ = 0;
      local_5f8._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
      auStack_5f0._0_8_ = auStack_5f0._0_8_ & 0xffffffffffffff00;
      __n = local_540._8_8_;
      if ((ulong)local_5b8._8_8_ < (ulong)local_540._8_8_) {
        __n = local_5b8._8_8_;
      }
      if (__n == 0) {
        bVar18 = true;
      }
      else {
        iVar9 = bcmp((void *)local_540._0_8_,(void *)local_5b8._0_8_,__n);
        bVar18 = iVar9 == 0;
      }
      local_5b8._40_8_ = p_Var15 + 2;
      _Var17._M_p._4_4_ = SUB84((ulong)in_stack_fffffffffffff9f8._M_p >> 0x20,0);
      if ((bool)(bVar18 ^ 1U | uVar7 != uVar6)) {
        in_stack_fffffffffffff9f8._M_p._4_4_ = _Var17._M_p._4_4_;
        in_stack_fffffffffffff9f8._M_p._0_4_ = 1;
      }
      else {
        if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          _Var17._M_p._0_4_ = 7;
          local_5e0 = (undefined1  [8])&DAT_0000003e;
          local_4a8._0_8_ = local_498;
          local_4a8._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_4a8,(ulong)local_5e0);
          local_498._0_8_ = local_5e0;
          *(undefined8 *)local_4a8._0_8_ = 0x79747265706f7250;
          builtin_strncpy((char *)(local_4a8._0_8_ + 8)," `{}` mu",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x10),"st be At",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x18),"tribute,",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x20)," but dec",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x28),"lared as",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x2e),"as Relat",8);
          builtin_strncpy((char *)(local_4a8._0_8_ + 0x36),"ionship.",8);
          local_4a8._8_8_ = local_5e0;
          *(char *)(local_4a8._0_8_ + (long)local_5e0) = '\0';
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_4a8,(string *)local_5b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
          ;
          ::std::__cxx11::string::operator=((string *)&local_600,(string *)local_2b0);
          in_stack_fffffffffffff9f8._M_p = _Var17._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._0_8_ != &local_2a0) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
            in_stack_fffffffffffff9f8._M_p = _Var17._M_p;
          }
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
        }
        if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_500._64_8_,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var15[6]._M_parent);
          in_stack_fffffffffffff9f8._M_p = in_stack_fffffffffffff9f8._M_p & 0xffffffff00000000;
        }
        Attribute::type_name_abi_cxx11_((string *)local_5e0,(Attribute *)local_5b8._40_8_);
        local_2b0._0_8_ = &local_2a0;
        stack0xfffffffffffffd58 = 5;
        local_2a0._M_allocated_capacity._0_6_ = 0x74616f6c66;
        if ((anon_struct_8_0_00000001_for___align)local_5d8 ==
            (anon_struct_8_0_00000001_for___align)0x5) {
          bVar18 = *(char *)((long)local_5e0 + 4) == 't' && *(int *)local_5e0 == 0x616f6c66;
        }
        else {
          bVar18 = false;
        }
        bVar19 = true;
        if (!bVar18) {
          local_540._32_8_ = local_510;
          local_510[4] = 0x74;
          local_510._0_4_ = 0x616f6c66;
          local_540._40_8_ = 5;
          local_510[5] = 0;
          if ((anon_struct_8_0_00000001_for___align)local_5d8 ==
              (anon_struct_8_0_00000001_for___align)0x5) {
            bVar19 = *(char *)((long)local_5e0 + 4) == 't' && *(int *)local_5e0 == 0x616f6c66;
          }
          else {
            bVar19 = false;
          }
        }
        if ((!bVar18) && ((undefined1 *)local_540._32_8_ != local_510)) {
          operator_delete((void *)local_540._32_8_,
                          CONCAT26(local_510._6_2_,
                                   CONCAT15(local_510[5],CONCAT14(local_510[4],local_510._0_4_))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
        }
        if (bVar19) {
          iVar9 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
          if (iVar9 != 1) {
            if (iVar9 == 0) {
              *(bool *)(local_5b8._56_8_ + 0x938) = true;
              AttrMetas::operator=((AttrMetas *)local_5b8._48_8_,(AttrMetas *)(p_Var15 + 7));
              __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b8;
LAB_0023c9d6:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_500,__v);
              in_stack_fffffffffffff9f8._M_p = in_stack_fffffffffffff9f8._M_p & 0xffffffff00000000;
            }
            else {
              warn = (string *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_600,0,(char *)local_5f8,0x400008);
              in_stack_fffffffffffff9f8._M_p._4_4_ =
                   SUB84((ulong)in_stack_fffffffffffff9f8._M_p >> 0x20,0);
              in_stack_fffffffffffff9f8._M_p._0_4_ = 8;
            }
            goto LAB_0023c9e2;
          }
          if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
            if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
              bVar18 = false;
            }
            else {
              iVar9 = (**(code **)p_Var15[4]._M_right)();
              bVar18 = iVar9 == 4;
            }
            if ((bVar18) || ((p_Var15[5]._M_color & _S_black) != _S_red)) {
              *(bool *)(local_5b8._56_8_ + 0x988) = true;
            }
          }
          if (((char)p_Var15[5]._M_color == _S_red) &&
             ((((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 0)) ||
               ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                (iVar9 = (**(code **)p_Var15[4]._M_right)(), iVar9 == 1)))) &&
              (p_Var15[5]._M_left == p_Var15[5]._M_parent)))) {
            bVar18 = true;
            bVar19 = false;
          }
          else {
            anon_unknown_0::ConvertToAnimatable<float>
                      ((optional<tinyusdz::Animatable<float>_> *)local_4a8,
                       (PrimVar *)&p_Var15[4]._M_parent);
            uVar8 = local_4a8[0];
            local_2b0[0] = local_4a8[0];
            if ((fmt)local_4a8[0] == (fmt)0x1) {
              uStack_2a4._0_2_ = local_4a8._12_2_;
              local_2b0._8_4_ = local_4a8._8_4_;
              local_2a0._M_allocated_capacity = local_498._0_8_;
              local_2a0._8_8_ = local_498._8_8_;
              auStack_290._0_8_ = local_498._16_8_;
              local_498._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_498._8_8_ = 0;
              local_498._16_8_ = 0;
              auStack_290[8] = local_480[0]._0_1_;
              nonstd::optional_lite::optional<tinyusdz::Animatable<float>>::operator=
                        ((optional<tinyusdz::Animatable<float>> *)local_500._48_8_,
                         (Animatable<float> *)(local_2b0 + 8));
            }
            else {
              in_stack_fffffffffffff9f8._M_p._4_4_ =
                   SUB84((ulong)in_stack_fffffffffffff9f8._M_p >> 0x20,0);
              in_stack_fffffffffffff9f8._M_p._0_4_ = 8;
              warn = (string *)0x55;
              ::std::__cxx11::string::_M_replace((ulong)&local_600,0,(char *)local_5f8,0x4002d6);
            }
            if ((local_2b0[0] == '\x01') &&
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_2a0._M_allocated_capacity !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              operator_delete((void *)local_2a0._M_allocated_capacity,
                              auStack_290._0_8_ - local_2a0._0_8_);
            }
            if ((fmt)uVar8 != (fmt)0x0) {
              AttrMetas::operator=((AttrMetas *)local_5b8._48_8_,(AttrMetas *)(p_Var15 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_500,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5b8);
              in_stack_fffffffffffff9f8._M_p = in_stack_fffffffffffff9f8._M_p & 0xffffffff00000000;
            }
            bVar19 = true;
            bVar18 = false;
          }
          if (bVar18) {
            if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
              AttrMetas::operator=((AttrMetas *)local_5b8._48_8_,(AttrMetas *)(p_Var15 + 7));
              __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
              goto LAB_0023c9d6;
            }
            goto LAB_0023c9e2;
          }
          if (local_5e0 != (undefined1  [8])local_5d0) {
            operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
          }
          if ((bVar19) ||
             (pcVar16 = (pointer)auStack_5f0._0_8_, _Var17._M_p = local_600._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._M_p ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f0))
          goto LAB_0023c9fe;
        }
        else {
          in_stack_fffffffffffff9f8._M_p._4_4_ =
               SUB84((ulong)in_stack_fffffffffffff9f8._M_p >> 0x20,0);
          in_stack_fffffffffffff9f8._M_p._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0._M_local_buf,"Property type mismatch. ",0x18);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0._M_local_buf,(char *)local_5b8._0_8_,
                               local_5b8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," expects type `",0xf);
          local_4a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
          local_498._0_6_ = 0x74616f6c66;
          local_4a8._0_8_ = local_498;
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_498,5);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"` but defined as type `",0x17);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_5e0,(long)local_5d8);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"`",1);
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_600,(string *)local_4a8);
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
LAB_0023c9e2:
          pcVar16 = (pointer)local_5d0._0_8_;
          _Var17._M_p = (pointer)local_5e0;
          if (local_5e0 == (undefined1  [8])local_5d0) goto LAB_0023c9fe;
        }
        operator_delete(_Var17._M_p,(ulong)(pcVar16 + 1));
      }
LAB_0023c9fe:
      if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
        operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
      }
      if ((undefined1 *)local_540._0_8_ != local_540 + 0x10) {
        operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
      }
      iVar9 = 0;
      if (((ulong)in_stack_fffffffffffff9f8._M_p & 0xfffffffd) == 0) {
        iVar9 = 3;
LAB_0023cc89:
        bVar18 = false;
      }
      else {
        bVar18 = true;
        if ((ResultCode)in_stack_fffffffffffff9f8._M_p != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0x1049);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          local_5e0 = (undefined1  [8])local_5d0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5e0,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_4a8,(fmt *)local_5e0,(string *)"inputs:fallback",
                     (char (*) [16])&local_600,warn);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_4a8._0_8_,local_4a8._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          uVar6 = local_5b8._32_8_;
          if (local_5e0 != (undefined1  [8])local_5d0) {
            operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
          }
          if ((string *)uVar6 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            paVar11 = (anon_struct_8_0_00000001_for___align *)
                      ::std::__cxx11::string::_M_append(local_5e0,*(ulong *)uVar6);
            aVar1 = (anon_struct_8_0_00000001_for___align)(paVar11 + 2);
            if (*paVar11 == aVar1) {
              local_498._0_8_ = *(undefined8 *)aVar1;
              local_498._8_8_ = paVar11[3];
              local_4a8._0_8_ = local_498;
            }
            else {
              local_498._0_8_ = *(undefined8 *)aVar1;
              local_4a8._0_8_ = *paVar11;
            }
            local_4a8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(paVar11 + 1);
            *paVar11 = aVar1;
            paVar11[1] = (anon_struct_8_0_00000001_for___align)0x0;
            *(undefined1 *)(paVar11 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)uVar6,(string *)local_4a8);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if (local_5e0 != (undefined1  [8])local_5d0) {
              operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_240);
          iVar9 = 1;
          goto LAB_0023cc89;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f0) {
        operator_delete(local_600._M_p,(ulong)(auStack_5f0._0_8_ + 1));
      }
      if (bVar18) {
        local_568 = (storage_t<double>)(p_Var15 + 1);
        iVar9 = ::std::__cxx11::string::compare((char *)local_568);
        if (iVar9 == 0) {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2d0,"inputs:varname","");
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_500,&local_2d0);
          bVar18 = cVar13._M_node == (_Base_ptr)(local_500 + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          stack0xfffffffffffffd58 = ((ulong)stack0xfffffffffffffd58 >> 8 & 0xffffff) << 8;
          local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffff0000;
          local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
          local_220 = (storage_t<double>)0x0;
          local_218 = false;
          local_110[0x10] = false;
          local_110._17_3_ = 0;
          local_110._20_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_110[0x18] = false;
          local_110._25_3_ = 0;
          local_110._28_4_ = (storage_t<unsigned_int>)0x0;
          local_110._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._8_8_ = 0;
          local_e8[0] = _S_red;
          local_e0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_268[8] = 0;
          aStack_278._8_8_ = 0;
          auStack_268._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_290._16_8_ = 0;
          aStack_278._M_allocated_capacity = 0;
          auStack_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_290._8_8_ = 0;
          local_228 = false;
          aiStack_240._8_8_ = (_Base_ptr)0x0;
          aiStack_230 = (ios_base  [8])0x0;
          auStack_268._32_8_ = 0;
          aiStack_240._0_8_ = 0;
          auStack_268._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_268._24_8_ = 0;
          local_1f0[0] = false;
          local_210._16_4_ = ResetToExplicit;
          local_210._20_4_ = EmptyAttrib;
          local_210._24_8_ = 0;
          local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = (pointer)0x0;
          aaStack_1e0[1]._8_1_ = false;
          aaStack_1e0[0]._8_8_ = 0;
          aaStack_1e0[1]._0_8_ = (pointer)0x0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aaStack_1e0[0]._M_allocated_capacity = 0;
          local_1a0[0] = '\0';
          local_1c0._16_8_ = (pointer)0x0;
          local_1c0._24_8_ = 0;
          local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = false;
          aStack_180._8_8_ = 0;
          auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._24_8_ = 0;
          aStack_180._M_allocated_capacity = 0;
          local_1a0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._16_8_ = (pointer)0x0;
          auStack_148[8] = '\0';
          auStack_170._32_8_ = (pointer)0x0;
          auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._24_8_ = 0;
          local_138[0x20] = false;
          local_138._16_8_ = 0;
          local_138._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138[8] = false;
          local_138._9_3_ = 0;
          local_138._12_4_ = (storage_t<tinyusdz::Path::PathType>)0x0;
          local_e0._8_8_ = local_e8;
          local_a8[0] = 0;
          local_e0._40_8_ = 0;
          local_e0._48_8_ = (pointer)0x0;
          local_e0._24_8_ = 0;
          local_e0._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_98[8] = 0;
          auStack_98._9_8_ = 0;
          local_a8._8_8_ = 0;
          auStack_98[0] = 0;
          auStack_98._1_7_ = 0;
          uStack_40 = false;
          uStack_3f = 0;
          local_60._16_8_ = 0;
          local_60._24_1_ = 0;
          local_60._25_7_ = 0;
          local_60.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_60._8_8_ = 0;
          local_80._16_8_ = (storage_t<double>)0x0;
          local_80._24_8_ = 0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = 0;
          local_2f0._0_8_ = (long)local_2f0 + 0x10;
          local_e0._16_8_ = local_e0._8_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2f0,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          warn = (string *)local_4a8;
          local_4a8._0_8_ = local_498;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)&stack0xfffffffffffff9f8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_500,(string *)local_2f0,(Property *)local_5b8._40_8_,warn,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          if ((undefined1 *)local_4a8._0_8_ != local_498) {
            operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
          }
          if (local_2f0._0_8_ != (long)local_2f0 + 0x10) {
            operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
          }
          if ((ResultCode)in_stack_fffffffffffff9f8._M_p == TypeMismatch) {
            local_310._0_8_ = local_300;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,*(long *)(p_Var15 + 1),
                       (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
            warn = (string *)local_4a8;
            local_4a8._0_8_ = local_498;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
            args = (Property *)local_5b8._40_8_;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_5e0,(_anonymous_namespace_ *)local_500,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)local_5b8._40_8_,(Property *)warn,(string *)local_570,
                       (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9f8._M_p);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            uVar6 = local_5b8._32_8_;
            pcVar5 = local_5b8 + 0x10;
            if ((undefined8 *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_5e0._0_4_ == 0) {
              iVar9 = 3;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4a8,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x1062);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              local_560[0] = local_550;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_560,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)local_5b8,(fmt *)local_560,(string *)local_5d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4a8,(char *)local_5b8._0_8_,local_5b8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              if ((char *)local_5b8._0_8_ != pcVar5) {
                operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
              }
              if (local_560[0] != local_550) {
                operator_delete(local_560[0],local_550[0] + 1);
              }
              if ((string *)uVar6 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar12 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)local_560,*(ulong *)uVar6);
                psVar3 = (size_type *)(plVar12 + 2);
                if ((size_type *)*plVar12 == psVar3) {
                  local_5b8._16_8_ = *psVar3;
                  local_5b8._24_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar12 + 3);
                  local_5b8._0_8_ = pcVar5;
                }
                else {
                  local_5b8._16_8_ = *psVar3;
                  local_5b8._0_8_ = (size_type *)*plVar12;
                }
                local_5b8._8_8_ = plVar12[1];
                *plVar12 = (long)psVar3;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)uVar6,(string *)local_5b8);
                if ((char *)local_5b8._0_8_ != pcVar5) {
                  operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
                }
                if (local_560[0] != local_550) {
                  operator_delete(local_560[0],local_550[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
              ::std::ios_base::~ios_base(local_438);
              iVar9 = 1;
            }
            if (local_5d8 != (undefined1  [8])((long)local_5d0 + 8)) {
              operator_delete((void *)local_5d8,local_5d0._8_8_ + 1);
            }
          }
          else {
            iVar9 = 0;
            if ((ResultCode)in_stack_fffffffffffff9f8._M_p == Success) {
              bVar18 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,local_570);
              iVar9 = 3;
              if (!bVar18) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_4a8,0x1050);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4a8,"\n",1);
                uVar6 = local_5b8._32_8_;
                if ((string *)local_5b8._32_8_ != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar12 = (long *)::std::__cxx11::string::_M_append(local_5b8,*(ulong *)uVar6);
                  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (plVar12 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12
                      == pbVar2) {
                    local_5d0._0_8_ = (pbVar2->_M_dataplus)._M_p;
                    local_5d0._8_8_ = plVar12[3];
                    local_5e0 = (undefined1  [8])local_5d0;
                  }
                  else {
                    local_5d0._0_8_ = (pbVar2->_M_dataplus)._M_p;
                    local_5e0 = (undefined1  [8])*plVar12;
                  }
                  local_5d8 = *(undefined1 (*) [8])(plVar12 + 1);
                  *plVar12 = (long)pbVar2;
                  plVar12[1] = 0;
                  *(undefined1 *)(plVar12 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)uVar6,(string *)local_5e0);
                  if (local_5e0 != (undefined1  [8])local_5d0) {
                    operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
                  }
                  if ((undefined1 *)local_5b8._0_8_ != local_5b8 + 0x10) {
                    operator_delete((void *)local_5b8._0_8_,local_5b8._16_8_ + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
                ::std::ios_base::~ios_base(local_438);
                iVar9 = 1;
              }
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5f0) {
            operator_delete(local_600._M_p,(ulong)(auStack_5f0._0_8_ + 1));
          }
          if (auStack_98[0x10] == '\x01') {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_a8 + 8));
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar9 != 0) goto LAB_0023db6d;
        }
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_330,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        local_2b0._0_8_ = &local_2a0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"outputs:result","");
        warn = (string *)local_2b0;
        anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                  ((ParseResult *)local_4a8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_500,&local_330,(Property *)local_5b8._40_8_,(string *)local_2b0,
                   (TypedTerminalAttribute<float> *)local_500._72_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._0_8_ != &local_2a0) {
          operator_delete((void *)local_2b0._0_8_,(ulong)(local_2a0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        iVar9 = 0;
        if ((local_4a8._0_8_ & 0xfffffffd) == 0) {
          iVar9 = 3;
LAB_0023d7d2:
          bVar18 = false;
        }
        else {
          bVar18 = true;
          if (local_4a8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x1068);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            local_5e0 = (undefined1  [8])local_5d0;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5e0,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)&stack0xfffffffffffff9f8,(fmt *)local_5e0,
                       (string *)"outputs:result",(char (*) [15])(local_4a8 + 8),warn);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,in_stack_fffffffffffff9f8._M_p,
                                 (long)local_600._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9f8._M_p !=
                (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5f8) {
              operator_delete(in_stack_fffffffffffff9f8._M_p,(long)local_5f8 + 1);
            }
            uVar6 = local_5b8._32_8_;
            if (local_5e0 != (undefined1  [8])local_5d0) {
              operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
            }
            if ((string *)uVar6 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar12 = (long *)::std::__cxx11::string::_M_append(local_5e0,*(ulong *)uVar6);
              pTVar4 = (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(plVar12 + 2);
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*plVar12 == pTVar4) {
                local_5f8 = (pTVar4->_metas).interpolation.has_value_;
                auStack_5f0._0_8_ = plVar12[3];
                in_stack_fffffffffffff9f8._M_p = (pointer)local_5f8;
              }
              else {
                local_5f8 = (pTVar4->_metas).interpolation.has_value_;
                in_stack_fffffffffffff9f8._M_p = (pointer)*plVar12;
              }
              local_600._M_p = (pointer)plVar12[1];
              *plVar12 = (long)pTVar4;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)uVar6,(string *)&stack0xfffffffffffff9f8);
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f8._M_p !=
                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5f8) {
                operator_delete(in_stack_fffffffffffff9f8._M_p,(long)local_5f8 + 1);
              }
              if (local_5e0 != (undefined1  [8])local_5d0) {
                operator_delete((void *)local_5e0,(ulong)(local_5d0._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
            iVar9 = 1;
            goto LAB_0023d7d2;
          }
        }
        if (local_4a8._8_8_ != (long)local_498 + 8) {
          operator_delete((void *)local_4a8._8_8_,local_498._8_8_ + 1);
        }
        __k = local_568;
        if (bVar18) {
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_500,(key_type *)local_568);
          if (cVar13._M_node == (_Base_ptr)(local_500 + 8)) {
            pmVar14 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                    *)local_500._56_8_,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar14);
            (pmVar14->_attrib)._varying_authored = (bool)p_Var15[3].field_0x4;
            (pmVar14->_attrib)._variability = p_Var15[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar14->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar14->_attrib)._var,(any *)&p_Var15[4]._M_parent);
            (pmVar14->_attrib)._var._blocked = SUB41(p_Var15[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar14->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var15[5]._M_parent);
            (pmVar14->_attrib)._var._ts._dirty = SUB41(p_Var15[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar14->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[6]._M_parent);
            AttrMetas::operator=(&(pmVar14->_attrib)._metas,(AttrMetas *)(p_Var15 + 7));
            *(_Base_ptr *)&pmVar14->_listOpQual = p_Var15[0x17]._M_parent;
            (pmVar14->_rel).type = *(Type *)&p_Var15[0x17]._M_left;
            Path::operator=(&(pmVar14->_rel).targetPath,(Path *)&p_Var15[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar14->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var15[0x1e]._M_parent);
            (pmVar14->_rel).listOpQual = p_Var15[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar14->_rel)._metas,(AttrMetas *)&p_Var15[0x1f]._M_parent);
            (pmVar14->_rel)._varying_authored = *(bool *)&p_Var15[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar14->_prop_value_type_name);
            __k = local_568;
            pmVar14->_has_custom = *(bool *)&p_Var15[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_500,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_568);
          }
          cVar13 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_500,(key_type *)__k);
          iVar9 = 0;
          if (cVar13._M_node == (_Base_ptr)(local_500 + 8)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((Property *)local_2b0,0x106a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_4a8,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_4a8._0_8_,local_4a8._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
            if ((undefined1 *)local_4a8._0_8_ != local_498) {
              operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
            }
            if ((string *)local_5b8._64_8_ != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              paVar11 = (anon_struct_8_0_00000001_for___align *)
                        ::std::__cxx11::string::_M_append
                                  (&stack0xfffffffffffff9f8,*(ulong *)local_5b8._32_8_);
              aVar1 = (anon_struct_8_0_00000001_for___align)(paVar11 + 2);
              if (*paVar11 == aVar1) {
                local_498._0_8_ = *(undefined8 *)aVar1;
                local_498._8_8_ = paVar11[3];
                local_4a8._0_8_ = local_498;
              }
              else {
                local_498._0_8_ = *(undefined8 *)aVar1;
                local_4a8._0_8_ = *paVar11;
              }
              local_4a8._8_8_ = *(anon_struct_8_0_00000001_for___align *)(paVar11 + 1);
              *paVar11 = aVar1;
              paVar11[1] = (anon_struct_8_0_00000001_for___align)0x0;
              *(undefined1 *)(paVar11 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_5b8._64_8_,(string *)local_4a8);
              if ((undefined1 *)local_4a8._0_8_ != local_498) {
                operator_delete((void *)local_4a8._0_8_,(ulong)(local_498._0_8_ + 1));
              }
              if ((TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9f8._M_p !=
                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5f8) {
                operator_delete(in_stack_fffffffffffff9f8._M_p,(long)local_5f8 + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
          }
        }
      }
LAB_0023db6d:
    } while (((iVar9 == 3) || (iVar9 == 0)) &&
            (p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15),
            p_Var15 != local_4b0));
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_500,(_Link_type)local_500._16_8_);
  return false;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return false;
}